

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void NextContext(CPpmd8 *p)

{
  uint uVar1;
  CPpmd8_Context *pCVar2;
  
  if ((p->OrderFall == 0) &&
     (uVar1._0_2_ = p->FoundState->SuccessorLow, uVar1._2_2_ = p->FoundState->SuccessorHigh,
     pCVar2 = (CPpmd8_Context *)(p->Base + uVar1), (CPpmd8_Context *)p->UnitsStart <= pCVar2)) {
    p->MaxContext = pCVar2;
  }
  else {
    UpdateModel(p);
    pCVar2 = p->MaxContext;
  }
  p->MinContext = pCVar2;
  return;
}

Assistant:

static void NextContext(CPpmd8 *p)
{
  CTX_PTR c = CTX(SUCCESSOR(p->FoundState));
  if (p->OrderFall == 0 && (Byte *)c >= p->UnitsStart)
    p->MinContext = p->MaxContext = c;
  else
  {
    UpdateModel(p);
    p->MinContext = p->MaxContext;
  }
}